

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

int quantifier_type_num(QuantNode *q)

{
  int iVar1;
  
  iVar1 = q->lower;
  if (q->greedy == 0) {
    if (iVar1 == 1) {
      if (q->upper == -1) {
        return 5;
      }
    }
    else if (iVar1 == 0) {
      iVar1 = 3;
      if (q->upper != 1) {
        iVar1 = (uint)(q->upper == -1) * 5 + -1;
      }
      return iVar1;
    }
  }
  else if (iVar1 == 1) {
    if (q->upper == -1) {
      return 2;
    }
  }
  else if (iVar1 == 0) {
    iVar1 = 0;
    if (q->upper != 1) {
      iVar1 = (uint)(q->upper == -1) * 2 + -1;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

static int
quantifier_type_num(QuantNode* q)
{
  if (q->greedy) {
    if (q->lower == 0) {
      if (q->upper == 1) return 0;
      else if (IS_INFINITE_REPEAT(q->upper)) return 1;
    }
    else if (q->lower == 1) {
      if (IS_INFINITE_REPEAT(q->upper)) return 2;
    }
  }
  else {
    if (q->lower == 0) {
      if (q->upper == 1) return 3;
      else if (IS_INFINITE_REPEAT(q->upper)) return 4;
    }
    else if (q->lower == 1) {
      if (IS_INFINITE_REPEAT(q->upper)) return 5;
    }
  }
  return -1;
}